

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

string * __thiscall
gl3cts::ReservedNamesTest::getShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,ReservedNamesTest *this,_shader_type shader_type,
          _language_feature language_feature,char *invalid_name)

{
  bool bVar1;
  ApiType AVar2;
  RenderContext *pRVar3;
  TestError *this_00;
  ostream *poVar4;
  ApiType local_1c8 [2];
  ApiType apiType;
  ContextType local_1b4;
  stringstream local_1b0 [4];
  ContextType context_type;
  stringstream body_sstream;
  ostream local_1a0;
  char *local_28;
  char *invalid_name_local;
  _language_feature language_feature_local;
  _shader_type shader_type_local;
  ReservedNamesTest *this_local;
  
  local_28 = invalid_name;
  invalid_name_local._0_4_ = language_feature;
  invalid_name_local._4_4_ = shader_type;
  _language_feature_local = this;
  this_local = (ReservedNamesTest *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  local_1b4.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  std::operator<<(&local_1a0,"#version ");
  local_1c8[0] = glu::ContextType::getAPI(&local_1b4);
  AVar2 = glu::ApiType::core(3,1);
  bVar1 = glu::ApiType::operator==(local_1c8,AVar2);
  if (bVar1) {
    std::operator<<(&local_1a0,"140");
  }
  else {
    AVar2 = glu::ApiType::core(3,2);
    bVar1 = glu::ApiType::operator==(local_1c8,AVar2);
    if (bVar1) {
      std::operator<<(&local_1a0,"150");
    }
    else {
      AVar2 = glu::ApiType::core(3,3);
      bVar1 = glu::ApiType::operator==(local_1c8,AVar2);
      if (bVar1) {
        std::operator<<(&local_1a0,"330");
      }
      else {
        AVar2 = glu::ApiType::core(4,0);
        bVar1 = glu::ApiType::operator==(local_1c8,AVar2);
        if (bVar1) {
          std::operator<<(&local_1a0,"400");
        }
        else {
          AVar2 = glu::ApiType::core(4,1);
          bVar1 = glu::ApiType::operator==(local_1c8,AVar2);
          if (bVar1) {
            std::operator<<(&local_1a0,"410");
          }
          else {
            AVar2 = glu::ApiType::core(4,2);
            bVar1 = glu::ApiType::operator==(local_1c8,AVar2);
            if (bVar1) {
              std::operator<<(&local_1a0,"420");
            }
            else {
              AVar2 = glu::ApiType::core(4,3);
              bVar1 = glu::ApiType::operator==(local_1c8,AVar2);
              if (bVar1) {
                std::operator<<(&local_1a0,"430");
              }
              else {
                AVar2 = glu::ApiType::core(4,4);
                bVar1 = glu::ApiType::operator==(local_1c8,AVar2);
                if (bVar1) {
                  std::operator<<(&local_1a0,"440");
                }
                else {
                  AVar2 = glu::ApiType::core(4,5);
                  bVar1 = glu::ApiType::operator==(local_1c8,AVar2);
                  if (!bVar1) {
                    this_00 = (TestError *)__cxa_allocate_exception(0x38);
                    tcu::TestError::TestError
                              (this_00,"Unsupported GL context version - please implement",
                               (char *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                               ,0x1278);
                    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                  }
                  std::operator<<(&local_1a0,"450");
                }
              }
            }
          }
        }
      }
    }
  }
  std::operator<<(&local_1a0,"\n\n");
  if (invalid_name_local._4_4_ == LANGUAGE_FEATURE_ATOMIC_COUNTER) {
    std::operator<<(&local_1a0,"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n")
    ;
  }
  else if (invalid_name_local._4_4_ == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME) {
    std::operator<<(&local_1a0,"layout(vertices = 3) out;\n");
  }
  else if (invalid_name_local._4_4_ == LANGUAGE_FEATURE_FUNCTION_NAME) {
    std::operator<<(&local_1a0,"layout(triangles) in;\n");
  }
  std::operator<<(&local_1a0,"\n\n");
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_ATOMIC_COUNTER) {
    poVar4 = std::operator<<(&local_1a0,"layout(binding = 0, offset = 0) uniform atomic_uint ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,";\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_ATTRIBUTE) {
    poVar4 = std::operator<<(&local_1a0,"attribute vec4 ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,";\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_CONSTANT) {
    poVar4 = std::operator<<(&local_1a0,"const vec4 ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4," = vec4(2.0, 3.0, 4.0, 5.0);\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME) {
    poVar4 = std::operator<<(&local_1a0,"void test(in vec4 ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,")\n{\n}\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_FUNCTION_NAME) {
    poVar4 = std::operator<<(&local_1a0,"void ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,"(in vec4 test)\n{\n}\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_INPUT) {
    poVar4 = std::operator<<(&local_1a0,"in vec4 ");
    std::operator<<(poVar4,local_28);
    if (((invalid_name_local._4_4_ == LANGUAGE_FEATURE_CONSTANT) ||
        (invalid_name_local._4_4_ == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME)) ||
       (invalid_name_local._4_4_ == LANGUAGE_FEATURE_FUNCTION_NAME)) {
      std::operator<<(&local_1a0,"[]");
    }
    std::operator<<(&local_1a0,";\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_INPUT_BLOCK_INSTANCE_NAME) {
    poVar4 = std::operator<<(&local_1a0,"in testBlock\n{\n    vec4 test;\n} ");
    std::operator<<(poVar4,local_28);
    if (((invalid_name_local._4_4_ == LANGUAGE_FEATURE_CONSTANT) ||
        (invalid_name_local._4_4_ == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME)) ||
       (invalid_name_local._4_4_ == LANGUAGE_FEATURE_FUNCTION_NAME)) {
      std::operator<<(&local_1a0,"[]");
    }
    std::operator<<(&local_1a0,";\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_INPUT_BLOCK_MEMBER_NAME) {
    poVar4 = std::operator<<(&local_1a0,"in testBlock\n{\n    vec4 ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,";\n} testBlockInstance");
    if (((invalid_name_local._4_4_ == LANGUAGE_FEATURE_CONSTANT) ||
        (invalid_name_local._4_4_ == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME)) ||
       (invalid_name_local._4_4_ == LANGUAGE_FEATURE_FUNCTION_NAME)) {
      std::operator<<(&local_1a0,"[]");
    }
    std::operator<<(&local_1a0,";\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_INPUT_BLOCK_NAME) {
    poVar4 = std::operator<<(&local_1a0,"in ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,"\n{\n    vec4 test;\n} testBlockInstance");
    if (((invalid_name_local._4_4_ == LANGUAGE_FEATURE_CONSTANT) ||
        (invalid_name_local._4_4_ == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME)) ||
       (invalid_name_local._4_4_ == LANGUAGE_FEATURE_FUNCTION_NAME)) {
      std::operator<<(&local_1a0,"[]");
    }
    std::operator<<(&local_1a0,";\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_OUTPUT) {
    poVar4 = std::operator<<(&local_1a0,"out vec4 ");
    std::operator<<(poVar4,local_28);
    if (invalid_name_local._4_4_ == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME) {
      std::operator<<(&local_1a0,"[]");
    }
    std::operator<<(&local_1a0,";\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME) {
    poVar4 = std::operator<<(&local_1a0,"out testBlock\n{\n    vec4 test;\n} ");
    std::operator<<(poVar4,local_28);
    if (invalid_name_local._4_4_ == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME) {
      std::operator<<(&local_1a0,"[]");
    }
    std::operator<<(&local_1a0,";\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME) {
    poVar4 = std::operator<<(&local_1a0,"out testBlock\n{\n    vec4 ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,";\n} testBlockInstance");
    if (invalid_name_local._4_4_ == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME) {
      std::operator<<(&local_1a0,"[]");
    }
    std::operator<<(&local_1a0,";\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME) {
    poVar4 = std::operator<<(&local_1a0,"out ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,"\n{\n    vec4 test;\n} testBlockInstance");
    if (invalid_name_local._4_4_ == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME) {
      std::operator<<(&local_1a0,"[]");
    }
    std::operator<<(&local_1a0,";\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME)
  {
    poVar4 = std::operator<<(&local_1a0,"buffer testBlock\n{\n    vec4 test;\n} ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,";\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME) {
    poVar4 = std::operator<<(&local_1a0,"buffer testBlock\n{\n    vec4 ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,";\n};\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME) {
    poVar4 = std::operator<<(&local_1a0,"buffer ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,"\n{\n    vec4 test;\n};\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME) {
    poVar4 = std::operator<<(&local_1a0,"subroutine void exampleSubroutine(inout vec4 ");
    poVar4 = std::operator<<(poVar4,local_28);
    poVar4 = std::operator<<(poVar4,");\n\nsubroutine (exampleSubroutine) void invert(inout vec4 ");
    poVar4 = std::operator<<(poVar4,local_28);
    poVar4 = std::operator<<(poVar4,")\n{\n    ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,
                    " += vec4(0.0, 1.0, 2.0, 3.0);\n}\n\nsubroutine uniform exampleSubroutine testSubroutine;\n"
                   );
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_SUBROUTINE_TYPE) {
    poVar4 = std::operator<<(&local_1a0,"subroutine void ");
    poVar4 = std::operator<<(poVar4,local_28);
    poVar4 = std::operator<<(poVar4,"(inout vec4 arg);\n\nsubroutine (");
    poVar4 = std::operator<<(poVar4,local_28);
    poVar4 = std::operator<<(poVar4,
                             ") void invert(inout vec4 arg)\n{\n    arg += vec4(0.0, 1.0, 2.0, 3.0);\n}\n\nsubroutine uniform "
                            );
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4," testSubroutine;\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_SUBROUTINE_UNIFORM) {
    poVar4 = std::operator<<(&local_1a0,
                             "subroutine void exampleSubroutine(inout vec4 arg);\n\nsubroutine (exampleSubroutine) void invert(inout vec4 arg)\n{\n    arg += vec4(0.0, 1.0, 2.0, 3.0);\n}\n\nsubroutine uniform exampleSubroutine "
                            );
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,";\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_UNIFORM) {
    poVar4 = std::operator<<(&local_1a0,"uniform sampler2D ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,";\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME) {
    poVar4 = std::operator<<(&local_1a0,"uniform testBlock\n{\n    vec4 test;\n} ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,";\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME) {
    poVar4 = std::operator<<(&local_1a0,"uniform testBlock\n{\n    vec4 ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,";\n};\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME) {
    poVar4 = std::operator<<(&local_1a0,"uniform ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,"\n{\n    vec4 test;\n};\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_VARYING) {
    poVar4 = std::operator<<(&local_1a0,"varying vec4 ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,";\n");
  }
  std::operator<<(&local_1a0,"void main()\n{\n");
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_SHARED_VARIABLE) {
    poVar4 = std::operator<<(&local_1a0,"shared vec4 ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,";\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_STRUCTURE_INSTANCE_NAME) {
    poVar4 = std::operator<<(&local_1a0,"struct\n{\n    vec4 test;\n} ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,";\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_STRUCTURE_MEMBER) {
    poVar4 = std::operator<<(&local_1a0,"struct\n{\n    vec4 ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,";\n} testInstance;\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_STRUCTURE_NAME) {
    poVar4 = std::operator<<(&local_1a0,"struct ");
    poVar4 = std::operator<<(poVar4,local_28);
    poVar4 = std::operator<<(poVar4,"{\n    vec4 test;\n");
    std::operator<<(poVar4,"};\n");
  }
  if ((_language_feature)invalid_name_local == LANGUAGE_FEATURE_VARIABLE) {
    poVar4 = std::operator<<(&local_1a0,"vec4 ");
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,";\n");
  }
  std::operator<<(&local_1a0,"}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string ReservedNamesTest::getShaderBody(_shader_type shader_type, _language_feature language_feature,
											 const char* invalid_name) const
{
	std::stringstream	  body_sstream;
	const glu::ContextType context_type = m_context.getRenderContext().getType();

	/* Preamble: shader language version */
	body_sstream << "#version ";

	glu::ApiType apiType = context_type.getAPI();
	if (apiType == glu::ApiType::core(3, 1))
		body_sstream << "140";
	else if (apiType == glu::ApiType::core(3, 2))
		body_sstream << "150";
	else if (apiType == glu::ApiType::core(3, 3))
		body_sstream << "330";
	else if (apiType == glu::ApiType::core(4, 0))
		body_sstream << "400";
	else if (apiType == glu::ApiType::core(4, 1))
		body_sstream << "410";
	else if (apiType == glu::ApiType::core(4, 2))
		body_sstream << "420";
	else if (apiType == glu::ApiType::core(4, 3))
		body_sstream << "430";
	else if (apiType == glu::ApiType::core(4, 4))
		body_sstream << "440";
	else if (apiType == glu::ApiType::core(4, 5))
		body_sstream << "450";
	else
	{
		TCU_FAIL("Unsupported GL context version - please implement");
	}

	body_sstream << "\n\n";

	/* Preamble: layout qualifiers - required for CS, TC and TE shader stages */
	if (shader_type == SHADER_TYPE_COMPUTE)
	{
		body_sstream << "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n";
	}
	else if (shader_type == SHADER_TYPE_TESS_CONTROL)
	{
		body_sstream << "layout(vertices = 3) out;\n";
	}
	else if (shader_type == SHADER_TYPE_TESS_EVALUATION)
	{
		body_sstream << "layout(triangles) in;\n";
	}

	body_sstream << "\n\n";

	/* Language feature: insert incorrectly named atomic counter declaration if needed */
	if (language_feature == LANGUAGE_FEATURE_ATOMIC_COUNTER)
	{
		body_sstream << "layout(binding = 0, offset = 0) uniform atomic_uint " << invalid_name << ";\n";
	}

	/* Language feature: insert incorrectly named attribute declaration if needed */
	if (language_feature == LANGUAGE_FEATURE_ATTRIBUTE)
	{
		body_sstream << "attribute vec4 " << invalid_name << ";\n";
	}

	/* Language feature: insert incorrectly name constant declaration if needed */
	if (language_feature == LANGUAGE_FEATURE_CONSTANT)
	{
		body_sstream << "const vec4 " << invalid_name << " = vec4(2.0, 3.0, 4.0, 5.0);\n";
	}

	/* Language feature: insert a function with incorrectly named argument if needed */
	if (language_feature == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME)
	{
		body_sstream << "void test(in vec4 " << invalid_name << ")\n"
																"{\n"
																"}\n";
	}

	/* Language feature: insert incorrectly named function if needed */
	if (language_feature == LANGUAGE_FEATURE_FUNCTION_NAME)
	{
		body_sstream << "void " << invalid_name << "(in vec4 test)\n"
												   "{\n"
												   "}\n";
	}

	/* Language feature: insert incorrectly named input variable if needed */
	if (language_feature == LANGUAGE_FEATURE_INPUT)
	{
		body_sstream << "in vec4 " << invalid_name;

		if (shader_type == SHADER_TYPE_GEOMETRY || shader_type == SHADER_TYPE_TESS_CONTROL ||
			shader_type == SHADER_TYPE_TESS_EVALUATION)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named input block instance if needed */
	if (language_feature == LANGUAGE_FEATURE_INPUT_BLOCK_INSTANCE_NAME)
	{
		body_sstream << "in testBlock\n"
						"{\n"
						"    vec4 test;\n"
						"} "
					 << invalid_name;

		if (shader_type == SHADER_TYPE_GEOMETRY || shader_type == SHADER_TYPE_TESS_CONTROL ||
			shader_type == SHADER_TYPE_TESS_EVALUATION)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an input block holding an incorrectly named member variable */
	if (language_feature == LANGUAGE_FEATURE_INPUT_BLOCK_MEMBER_NAME)
	{
		body_sstream << "in testBlock\n"
						"{\n"
						"    vec4 "
					 << invalid_name << ";\n"
										"} testBlockInstance";

		if (shader_type == SHADER_TYPE_GEOMETRY || shader_type == SHADER_TYPE_TESS_CONTROL ||
			shader_type == SHADER_TYPE_TESS_EVALUATION)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named input block */
	if (language_feature == LANGUAGE_FEATURE_INPUT_BLOCK_NAME)
	{
		body_sstream << "in " << invalid_name << "\n"
												 "{\n"
												 "    vec4 test;\n"
												 "} testBlockInstance";

		if (shader_type == SHADER_TYPE_GEOMETRY || shader_type == SHADER_TYPE_TESS_CONTROL ||
			shader_type == SHADER_TYPE_TESS_EVALUATION)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert incorrectly named output variable if needed */
	if (language_feature == LANGUAGE_FEATURE_OUTPUT)
	{
		body_sstream << "out vec4 " << invalid_name;

		if (shader_type == SHADER_TYPE_TESS_CONTROL)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named output block instance if needed */
	if (language_feature == LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME)
	{
		body_sstream << "out testBlock\n"
						"{\n"
						"    vec4 test;\n"
						"} "
					 << invalid_name;

		if (shader_type == SHADER_TYPE_TESS_CONTROL)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an output block holding an incorrectly named member variable */
	if (language_feature == LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME)
	{
		body_sstream << "out testBlock\n"
						"{\n"
						"    vec4 "
					 << invalid_name << ";\n"
										"} testBlockInstance";

		if (shader_type == SHADER_TYPE_TESS_CONTROL)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named output block */
	if (language_feature == LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME)
	{
		body_sstream << "out " << invalid_name << "\n"
												  "{\n"
												  "    vec4 test;\n"
												  "} testBlockInstance";

		if (shader_type == SHADER_TYPE_TESS_CONTROL)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named shader storage block instance if needed */
	if (language_feature == LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME)
	{
		body_sstream << "buffer testBlock\n"
						"{\n"
						"    vec4 test;\n"
						"} "
					 << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of a shader storage block holding an incorrectly named member variable */
	if (language_feature == LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME)
	{
		body_sstream << "buffer testBlock\n"
						"{\n"
						"    vec4 "
					 << invalid_name << ";\n"
										"};\n";
	}

	/* Language feature: insert declaration of an incorrectly named shader storage block */
	if (language_feature == LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME)
	{
		body_sstream << "buffer " << invalid_name << "\n"
													 "{\n"
													 "    vec4 test;\n"
													 "};\n";
	}

	/* Language feature: insert declaration of a subroutine function with invalid name */
	if (language_feature == LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME)
	{
		body_sstream << "subroutine void exampleSubroutine(inout vec4 " << invalid_name
					 << ");\n"
						"\n"
						"subroutine (exampleSubroutine) void invert(inout vec4 "
					 << invalid_name << ")\n"
										"{\n"
										"    "
					 << invalid_name << " += vec4(0.0, 1.0, 2.0, 3.0);\n"
										"}\n"
										"\n"
										"subroutine uniform exampleSubroutine testSubroutine;\n";
	}

	/* Language feature: insert declaration of a subroutine of incorrectly named type */
	if (language_feature == LANGUAGE_FEATURE_SUBROUTINE_TYPE)
	{
		body_sstream << "subroutine void " << invalid_name << "(inout vec4 arg);\n"
															  "\n"
															  "subroutine ("
					 << invalid_name << ") void invert(inout vec4 arg)\n"
										"{\n"
										"    arg += vec4(0.0, 1.0, 2.0, 3.0);\n"
										"}\n"
										"\n"
										"subroutine uniform "
					 << invalid_name << " testSubroutine;\n";
	}

	/* Language feature: insert declaration of a subroutine, followed by a declaration of
	 *                   an incorrectly named subroutine uniform.
	 */
	if (language_feature == LANGUAGE_FEATURE_SUBROUTINE_UNIFORM)
	{
		body_sstream << "subroutine void exampleSubroutine(inout vec4 arg);\n"
						"\n"
						"subroutine (exampleSubroutine) void invert(inout vec4 arg)\n"
						"{\n"
						"    arg += vec4(0.0, 1.0, 2.0, 3.0);\n"
						"}\n"
						"\n"
						"subroutine uniform exampleSubroutine "
					 << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named uniform. */
	if (language_feature == LANGUAGE_FEATURE_UNIFORM)
	{
		body_sstream << "uniform sampler2D " << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named uniform block instance if needed */
	if (language_feature == LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME)
	{
		body_sstream << "uniform testBlock\n"
						"{\n"
						"    vec4 test;\n"
						"} "
					 << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of an uniform block holding an incorrectly named member variable */
	if (language_feature == LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME)
	{
		body_sstream << "uniform testBlock\n"
						"{\n"
						"    vec4 "
					 << invalid_name << ";\n"
										"};\n";
	}

	/* Language feature: insert declaration of an incorrectly named uniform block */
	if (language_feature == LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME)
	{
		body_sstream << "uniform " << invalid_name << "\n"
													  "{\n"
													  "    vec4 test;\n"
													  "};\n";
	}

	/* Language feature: insert declaration of an incorrectly named varying */
	if (language_feature == LANGUAGE_FEATURE_VARYING)
	{
		body_sstream << "varying vec4 " << invalid_name << ";\n";
	}

	/* Start implementation of the main entry-point. */
	body_sstream << "void main()\n"
					"{\n";

	/* Language feature: insert declaration of an incorrectly named shared variable. */
	if (language_feature == LANGUAGE_FEATURE_SHARED_VARIABLE)
	{
		body_sstream << "shared vec4 " << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of a structure, whose instance name is incorrect */
	if (language_feature == LANGUAGE_FEATURE_STRUCTURE_INSTANCE_NAME)
	{
		body_sstream << "struct\n"
						"{\n"
						"    vec4 test;\n"
						"} "
					 << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of a structure with one of its member variables being incorrectly named. */
	if (language_feature == LANGUAGE_FEATURE_STRUCTURE_MEMBER)
	{
		body_sstream << "struct\n"
						"{\n"
						"    vec4 "
					 << invalid_name << ";\n"
										"} testInstance;\n";
	}

	/* Language feature: insert declaration of a structure whose name is incorrect */
	if (language_feature == LANGUAGE_FEATURE_STRUCTURE_NAME)
	{
		body_sstream << "struct " << invalid_name << "{\n"
													 "    vec4 test;\n"
					 << "};\n";
	}

	/* Language feature: insert declaration of a variable with incorrect name. */
	if (language_feature == LANGUAGE_FEATURE_VARIABLE)
	{
		body_sstream << "vec4 " << invalid_name << ";\n";
	}

	/* Close the main entry-point implementation */
	body_sstream << "}\n";

	return body_sstream.str();
}